

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O1

void __thiscall ImPool<ImPlotPlot>::Clear(ImPool<ImPlotPlot> *this)

{
  uint uVar1;
  ImPlotPlot *pIVar2;
  void *ptr;
  int *ptr_00;
  ImGuiStoragePair *ptr_01;
  ulong uVar3;
  long lVar4;
  ImPool<ImPlotItem> *this_00;
  long lVar5;
  
  if (0 < (this->Map).Data.Size) {
    lVar5 = 8;
    lVar4 = 0;
    do {
      uVar1 = *(uint *)((long)&((this->Map).Data.Data)->key + lVar5);
      uVar3 = (ulong)uVar1;
      if (uVar3 != 0xffffffff) {
        if (((int)uVar1 < 0) || ((this->Buf).Size <= (int)uVar1)) {
          __assert_fail("i >= 0 && i < Size",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui.h"
                        ,0x68b,"T &ImVector<ImPlotPlot>::operator[](int) [T = ImPlotPlot]");
        }
        pIVar2 = (this->Buf).Data;
        this_00 = &pIVar2[uVar3].Items;
        ImPool<ImPlotItem>::~ImPool(this_00);
        ptr = *(void **)((long)(this_00 + -1) + 0x20);
        if (ptr != (void *)0x0) {
          ImGui::MemFree(ptr);
        }
        ptr_00 = pIVar2[uVar3].LegendData.Indices.Data;
        if (ptr_00 != (int *)0x0) {
          ImGui::MemFree(ptr_00);
        }
      }
      lVar4 = lVar4 + 1;
      lVar5 = lVar5 + 0x10;
    } while (lVar4 < (this->Map).Data.Size);
  }
  ptr_01 = (this->Map).Data.Data;
  if (ptr_01 != (ImGuiStoragePair *)0x0) {
    (this->Map).Data.Size = 0;
    (this->Map).Data.Capacity = 0;
    ImGui::MemFree(ptr_01);
    (this->Map).Data.Data = (ImGuiStoragePair *)0x0;
  }
  pIVar2 = (this->Buf).Data;
  if (pIVar2 != (ImPlotPlot *)0x0) {
    (this->Buf).Size = 0;
    (this->Buf).Capacity = 0;
    ImGui::MemFree(pIVar2);
    (this->Buf).Data = (ImPlotPlot *)0x0;
  }
  this->FreeIdx = 0;
  this->AliveCount = 0;
  return;
}

Assistant:

void        Clear()                             { for (int n = 0; n < Map.Data.Size; n++) { int idx = Map.Data[n].val_i; if (idx != -1) Buf[idx].~T(); } Map.Clear(); Buf.clear(); FreeIdx = AliveCount = 0; }